

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cvars.cpp
# Opt level: O0

int FColorCVar::ToInt2(UCVarValue value,ECVarType type)

{
  bool bVar1;
  FString *this;
  char *cstr;
  byte local_41;
  FString local_28;
  FString local_20;
  FString string;
  int ret;
  ECVarType type_local;
  UCVarValue value_local;
  
  string.Chars._4_4_ = type;
  if (type == CVAR_String) {
    FString::FString(&local_20);
    local_41 = 0;
    if (screen != (DFrameBuffer *)0x0) {
      V_GetColorStringByName((char *)&local_28);
      this = FString::operator=(&local_20,&local_28);
      bVar1 = FString::IsEmpty(this);
      local_41 = bVar1 ^ 0xff;
      FString::~FString(&local_28);
    }
    if ((local_41 & 1) == 0) {
      string.Chars._0_4_ = V_GetColorFromString((DWORD *)0x0,value.String);
    }
    else {
      cstr = FString::operator_cast_to_char_(&local_20);
      string.Chars._0_4_ = V_GetColorFromString((DWORD *)0x0,cstr);
    }
    FString::~FString(&local_20);
  }
  else {
    string.Chars._0_4_ = FBaseCVar::ToInt(value,type);
  }
  return (int)string.Chars;
}

Assistant:

int FColorCVar::ToInt2 (UCVarValue value, ECVarType type)
{
	int ret;

	if (type == CVAR_String)
	{
		FString string;
		// Only allow named colors after the screen exists (i.e. after
		// we've got some lumps loaded, so X11R6RGB can be read). Since
		// the only time this might be called before that is when loading
		// zdoom.ini, this shouldn't be a problem.
		if (screen && !(string = V_GetColorStringByName (value.String)).IsEmpty() )
		{
			ret = V_GetColorFromString (NULL, string);
		}
		else
		{
			ret = V_GetColorFromString (NULL, value.String);
		}
	}
	else
	{
		ret = ToInt (value, type);
	}
	return ret;
}